

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void * __thiscall
pugi::impl::anon_unknown_0::xml_allocator::allocate_memory
          (xml_allocator *this,size_t size,xml_memory_page **out_page)

{
  ulong uVar1;
  size_t sVar2;
  xml_memory_page *pxVar3;
  xml_memory_page *pxVar4;
  size_t *psVar5;
  long lVar6;
  
  sVar2 = this->_busy_size;
  uVar1 = sVar2 + size;
  if (uVar1 < 0x7fd9) {
    pxVar4 = this->_root;
    this->_busy_size = uVar1;
    *out_page = pxVar4;
    return (void *)((long)&pxVar4[1].allocator + sVar2);
  }
  lVar6 = 0x8000;
  if (0x1ff6 < size) {
    lVar6 = size + 0x28;
  }
  pxVar4 = (xml_memory_page *)
           (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::allocate)
                     (lVar6);
  if (pxVar4 == (xml_memory_page *)0x0) {
    *out_page = (xml_memory_page *)0x0;
    pxVar4 = (xml_memory_page *)0x0;
  }
  else {
    pxVar4->next = (xml_memory_page *)0x0;
    pxVar4->busy_size = 0;
    pxVar4->freed_size = 0;
    pxVar4->allocator = (xml_allocator *)0x0;
    pxVar4->prev = (xml_memory_page *)0x0;
    if (this->_root->allocator != this) {
      __assert_fail("this == _root->allocator",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                    ,0x213,
                    "xml_memory_page *pugi::impl::(anonymous namespace)::xml_allocator::allocate_page(size_t)"
                   );
    }
    pxVar4->allocator = this;
    *out_page = pxVar4;
    if (size < 0x1ff7) {
      psVar5 = &this->_busy_size;
      pxVar3 = this->_root;
      pxVar3->busy_size = this->_busy_size;
      pxVar4->prev = pxVar3;
      pxVar3->next = pxVar4;
      this->_root = pxVar4;
    }
    else {
      pxVar3 = this->_root;
      if (pxVar3->prev == (xml_memory_page *)0x0) {
        __assert_fail("_root->prev",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                      ,0x2de,
                      "void *pugi::impl::(anonymous namespace)::xml_allocator::allocate_memory_oob(size_t, xml_memory_page *&)"
                     );
      }
      pxVar4->prev = pxVar3->prev;
      pxVar4->next = pxVar3;
      pxVar3->prev->next = pxVar4;
      pxVar3->prev = pxVar4;
      psVar5 = &pxVar4->busy_size;
    }
    *psVar5 = size;
    pxVar4 = pxVar4 + 1;
  }
  return pxVar4;
}

Assistant:

void* allocate_memory(size_t size, xml_memory_page*& out_page)
		{
			if (PUGI__UNLIKELY(_busy_size + size > xml_memory_page_size))
				return allocate_memory_oob(size, out_page);

			void* buf = reinterpret_cast<char*>(_root) + sizeof(xml_memory_page) + _busy_size;

			_busy_size += size;

			out_page = _root;

			return buf;
		}